

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,uint8 *target,EpsCopyOutputStream *stream)

{
  MessageLite *pMVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  LogMessage *other;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  LogMessage local_70;
  LogFinisher local_31;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      target[0] = '\v';
      target[1] = '\x10';
      if ((uint)number < 0x80) {
        target[2] = (byte)number;
        puVar6 = target + 3;
      }
      else {
        target[2] = (byte)number | 0x80;
        if ((uint)number < 0x4000) {
          target[3] = (uint8)((uint)number >> 7);
          puVar6 = target + 4;
        }
        else {
          puVar6 = target + 4;
          uVar3 = (uint)number >> 7;
          do {
            puVar7 = puVar6;
            puVar7[-1] = (byte)uVar3 | 0x80;
            uVar5 = uVar3 >> 7;
            puVar6 = puVar7 + 1;
            bVar2 = 0x3fff < uVar3;
            uVar3 = uVar5;
          } while (bVar2);
          *puVar7 = (uint8)uVar5;
        }
      }
      pMVar1 = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) == 0) {
        *puVar6 = '\x1a';
        uVar3 = (*pMVar1->_vptr_MessageLite[10])(pMVar1);
        if (uVar3 < 0x80) {
          puVar6[1] = (byte)uVar3;
          puVar6 = puVar6 + 2;
        }
        else {
          puVar6[1] = (byte)uVar3 | 0x80;
          if (uVar3 < 0x4000) {
            puVar6[2] = (uint8)(uVar3 >> 7);
            puVar6 = puVar6 + 3;
          }
          else {
            puVar6 = puVar6 + 3;
            uVar3 = uVar3 >> 7;
            do {
              puVar7 = puVar6;
              puVar7[-1] = (byte)uVar3 | 0x80;
              uVar5 = uVar3 >> 7;
              puVar6 = puVar7 + 1;
              bVar2 = 0x3fff < uVar3;
              uVar3 = uVar5;
            } while (bVar2);
            *puVar7 = (uint8)uVar5;
          }
        }
        iVar4 = (*pMVar1->_vptr_MessageLite[0xc])(pMVar1,puVar6,stream);
        puVar6 = (uint8 *)CONCAT44(extraout_var_00,iVar4);
      }
      else {
        iVar4 = (*pMVar1->_vptr_MessageLite[0x11])(pMVar1,3,puVar6,stream);
        puVar6 = (uint8 *)CONCAT44(extraout_var,iVar4);
      }
      if (stream->end_ <= puVar6) {
        puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
      }
      *puVar6 = '\f';
      target = puVar6 + 1;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x820);
    other = LogMessage::operator<<(&local_70,"Invalid message set extension.");
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_70);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,target,stream);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, uint8* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, target, stream);
  }

  if (is_cleared) return target;

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->WriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, *message_value, target,
        stream);
  }
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}